

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase623::run(TestCase623 *this)

{
  TimerImpl *pTVar1;
  PromiseNode *pPVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  __sighandler_t p_Var5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  WaitScope waitScope;
  itimerval itv;
  EventLoop loop;
  UnixEventPort port;
  Own<kj::_::PromiseNode> local_2e8;
  WaitScope local_2d8;
  itimerval local_2c8;
  EventLoop local_2a0;
  UnixEventPort local_268;
  NullableValue<kj::Exception> local_188;
  char local_28;
  
  captureSignals();
  UnixEventPort::UnixEventPort(&local_268);
  EventLoop::EventLoop(&local_2a0,&local_268.super_EventPort);
  local_2d8.busyPollInterval = 0xffffffff;
  local_2d8.loop = &local_2a0;
  EventLoop::enterScope(&local_2a0);
  pTVar1 = &local_268.timerImpl;
  iVar3 = (**local_268.timerImpl.super_Timer._vptr_Timer)(pTVar1);
  (anonymous_namespace)::dummySignalHandlerCalled = '\0';
  p_Var5 = signal(0xe,dummySignalHandler);
  if (p_Var5 == (__sighandler_t)0xffffffffffffffff) {
    __errno_location();
    local_2c8.it_interval.tv_sec = 0;
    local_188.isSet = false;
    local_188._1_7_ = 0;
    local_188.field_1.value.ownFile.content.ptr = (char *)0x0;
    _::Debug::Fault::init
              ((Fault *)&local_2c8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_2c8);
  }
  local_2c8.it_value.tv_sec = 0;
  local_2c8.it_interval.tv_sec = 0;
  local_2c8.it_interval.tv_usec = 0;
  local_2c8.it_value.tv_usec = 50000;
  setitimer(ITIMER_REAL,&local_2c8,(itimerval *)0x0);
  (*local_268.timerImpl.super_Timer._vptr_Timer[2])(&local_2e8,pTVar1,100000000);
  local_188._0_8_ = local_188._0_8_ & 0xffffffffffffff00;
  local_28 = '\0';
  _::waitImpl(&local_2e8,(ExceptionOrValue *)&local_188,&local_2d8);
  if (local_28 == '\x01') {
    if (local_188.isSet != false) {
      throwRecoverableException(&local_188.field_1.value,0);
    }
  }
  else {
    if (local_188.isSet == false) {
      _::unreachable();
    }
    throwRecoverableException(&local_188.field_1.value,0);
  }
  if (local_188.isSet == true) {
    Exception::~Exception(&local_188.field_1.value);
  }
  pPVar2 = local_2e8.ptr;
  if (local_2e8.ptr != (PromiseNode *)0x0) {
    local_2e8.ptr = (PromiseNode *)0x0;
    (**(local_2e8.disposer)->_vptr_Disposer)
              (local_2e8.disposer,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
  }
  if (((anonymous_namespace)::dummySignalHandlerCalled == '\0') && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x291,ERROR,"\"failed: expected \" \"dummySignalHandlerCalled\"",
               (char (*) [42])"failed: expected dummySignalHandlerCalled");
  }
  iVar4 = (**local_268.timerImpl.super_Timer._vptr_Timer)(pTVar1);
  if ((CONCAT44(extraout_var_00,iVar4) - CONCAT44(extraout_var,iVar3) < 100000000) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x292,ERROR,"\"failed: expected \" \"timer.now() - start >= timeout\"",
               (char (*) [48])"failed: expected timer.now() - start >= timeout");
  }
  iVar4 = (**local_268.timerImpl.super_Timer._vptr_Timer)(pTVar1);
  if ((120000000 < CONCAT44(extraout_var_01,iVar4) - CONCAT44(extraout_var,iVar3)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[64]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x293,ERROR,
               "\"failed: expected \" \"timer.now() - start <= timeout + (timeout / 5)\"",
               (char (*) [64])"failed: expected timer.now() - start <= timeout + (timeout / 5)");
  }
  EventLoop::leaveScope(local_2d8.loop);
  EventLoop::~EventLoop(&local_2a0);
  UnixEventPort::~UnixEventPort(&local_268);
  return;
}

Assistant:

TEST(AsyncUnixTest, InterruptedTimer) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

#if __linux__
  // Linux timeslices are 1ms.
  constexpr auto OS_SLOWNESS_FACTOR = 1;
#else
  // OSX timeslices are 10ms, so we need longer timeouts to avoid flakiness.
  // To be safe we'll assume other OS's are similar.
  constexpr auto OS_SLOWNESS_FACTOR = 10;
#endif

  // Schedule a timer event in 100ms.
  auto& timer = port.getTimer();
  auto start = timer.now();
  constexpr auto timeout = 100 * MILLISECONDS * OS_SLOWNESS_FACTOR;

  // Arrange SIGALRM to be delivered in 50ms, handled in an empty signal handler. This will cause
  // our wait to be interrupted with EINTR. We should nevertheless continue waiting for the right
  // amount of time.
  dummySignalHandlerCalled = false;
  if (signal(SIGALRM, &dummySignalHandler) == SIG_ERR) {
    KJ_FAIL_SYSCALL("signal(SIGALRM)", errno);
  }
  struct itimerval itv;
  memset(&itv, 0, sizeof(itv));
  itv.it_value.tv_usec = 50000 * OS_SLOWNESS_FACTOR;  // signal after 50ms
  setitimer(ITIMER_REAL, &itv, nullptr);

  timer.afterDelay(timeout).wait(waitScope);

  KJ_EXPECT(dummySignalHandlerCalled);
  KJ_EXPECT(timer.now() - start >= timeout);
  KJ_EXPECT(timer.now() - start <= timeout + (timeout / 5));  // allow 20ms error
}